

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeparser.cpp
# Opt level: O3

void __thiscall QMakeParser::message(QMakeParser *this,int type,QString *msg)

{
  QMakeParserHandler *pQVar1;
  ProFile *pPVar2;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QArrayData *local_28;
  char16_t *local_20;
  qsizetype local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_inError == false) && (pQVar1 = this->m_handler, pQVar1 != (QMakeParserHandler *)0x0))
  {
    pPVar2 = this->m_proFile;
    local_28 = &((pPVar2->m_fileName).d.d)->super_QArrayData;
    local_20 = (pPVar2->m_fileName).d.ptr;
    local_18 = (pPVar2->m_fileName).d.size;
    if (local_28 != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&local_28->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)&local_28->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (*(code *)**(undefined8 **)pQVar1)
              (pQVar1,CONCAT44(in_register_00000034,type),msg,&local_28,this->m_lineNo);
    if (local_28 != (QArrayData *)0x0) {
      LOCK();
      (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_28,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMakeParser::message(int type, const QString &msg) const
{
    if (!m_inError && m_handler)
        m_handler->message(type, msg, m_proFile->fileName(), m_lineNo);
}